

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,block_statement *s)

{
  pointer puVar1;
  pointer puVar2;
  strict_mode_scope sms;
  strict_mode_scope local_80;
  completion local_70;
  
  strict_mode_scope::strict_mode_scope(&local_80,this,s->strict_mode_);
  completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
  puVar2 = (s->l_).
           super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (s->l_).
           super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar2 == puVar1) break;
    eval(&local_70,this,
         (puVar2->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
    completion::operator=(__return_storage_ptr__,&local_70);
    value::~value(&local_70.result);
    puVar2 = puVar2 + 1;
  } while (__return_storage_ptr__->type == normal);
  (local_80.impl_)->strict_mode_ = local_80.prev_;
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const block_statement& s) {
        strict_mode_scope sms{*this, s.strict_mode()};
        completion c{};
        for (const auto& bs: s.l()) {
            c = eval(*bs);
            if (c) break;
        }
        return c;
    }